

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O3

QCursor __thiscall
QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::separatorCursor
          (QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *this,QList<int> *path)

{
  QDockAreaLayoutInfo *pQVar1;
  ulong uVar2;
  QList<int> *in_RDX;
  CursorShape CVar3;
  
  pQVar1 = QDockAreaLayout::info((QDockAreaLayout *)(path + 0x10),in_RDX);
  if (((in_RDX->d).size == 1) && (uVar2 = (ulong)(uint)*(in_RDX->d).ptr, uVar2 < 4)) {
    CVar3 = *(CursorShape *)(&DAT_006d9200 + uVar2 * 4);
  }
  else {
    CVar3 = (pQVar1->o == Horizontal) + SplitVCursor;
  }
  QCursor::QCursor((QCursor *)this,CVar3);
  return (QCursor)(QCursorData *)this;
}

Assistant:

QCursor QMainWindowLayoutSeparatorHelper<Layout>::separatorCursor(const QList<int> &path)
{
    const QDockAreaLayoutInfo *info = layout()->dockAreaLayoutInfo()->info(path);
    Q_ASSERT(info != nullptr);
    if (path.size() == 1) { // is this the "top-level" separator which separates a dock area
                            // from the central widget?
        switch (path.first()) {
        case QInternal::LeftDock:
        case QInternal::RightDock:
            return Qt::SplitHCursor;
        case QInternal::TopDock:
        case QInternal::BottomDock:
            return Qt::SplitVCursor;
        default:
            break;
        }
    }

    // no, it's a splitter inside a dock area, separating two dock widgets

    return info->o == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor;
}